

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vec4 __thiscall tcu::sRGBToLinear(tcu *this,Vec4 *cs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar5;
  ulong uVar4;
  
  fVar1 = cs->m_data[0];
  if (fVar1 <= 0.04045) {
    fVar1 = fVar1 / 12.92;
  }
  else {
    fVar1 = powf((fVar1 + 0.055) / 1.055,2.4);
  }
  fVar2 = cs->m_data[1];
  if (fVar2 <= 0.04045) {
    fVar2 = fVar2 / 12.92;
  }
  else {
    fVar2 = powf((fVar2 + 0.055) / 1.055,2.4);
  }
  fVar3 = cs->m_data[2];
  if (fVar3 <= 0.04045) {
    uVar4 = (ulong)(uint)(fVar3 / 12.92);
  }
  else {
    fVar3 = powf((fVar3 + 0.055) / 1.055,2.4);
    uVar4 = CONCAT44(extraout_XMM0_Db,fVar3);
  }
  fVar3 = cs->m_data[3];
  *(float *)this = fVar1;
  *(float *)(this + 4) = fVar2;
  *(int *)(this + 8) = (int)uVar4;
  *(float *)(this + 0xc) = fVar3;
  VVar5.m_data[2] = fVar3;
  VVar5.m_data[0] = (float)(int)uVar4;
  VVar5.m_data[1] = (float)(int)(uVar4 >> 0x20);
  VVar5.m_data[3] = 0.0;
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 sRGBToLinear (const Vec4& cs)
{
	return Vec4(sRGBChannelToLinear(cs[0]),
				sRGBChannelToLinear(cs[1]),
				sRGBChannelToLinear(cs[2]),
				cs[3]);
}